

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::doRemoveCol(SPxSolverBase<double> *this,int i)

{
  uint uVar1;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::doRemoveCol(&this->super_SPxLPBase<double>,i);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    SPxBasisBase<double>::removedCol(&this->super_SPxBasisBase<double>,i);
    uVar1 = (this->super_SPxBasisBase<double>).thestatus + NO_PROBLEM;
    if (uVar1 < 3) {
      setBasisStatus(this,*(SPxStatus *)(&DAT_002dbed0 + (ulong)uVar1 * 4));
      return;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCol(int i)
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCol(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCol(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}